

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# utilities.cc
# Opt level: O3

void google::DumpStackTraceAndExit(void)

{
  bool bVar1;
  void *in_RDX;
  sigaction sig_action;
  _union_1457 local_a8;
  sigset_t local_a0;
  
  DumpStackTrace(0x122fdc,(DebugWriter *)0x0,in_RDX);
  bVar1 = glog_internal_namespace_::IsFailureSignalHandlerInstalled();
  if (bVar1) {
    memset(&local_a8,0,0x98);
    sigemptyset(&local_a0);
    local_a8.sa_handler = (__sighandler_t)0x0;
    sigaction(6,(sigaction *)&local_a8,(sigaction *)0x0);
  }
  abort();
}

Assistant:

static void DumpStackTraceAndExit() {
  DumpStackTrace(1, DebugWriteToStderr, NULL);

  // TODO(hamaji): Use signal instead of sigaction?
  if (IsFailureSignalHandlerInstalled()) {
    // Set the default signal handler for SIGABRT, to avoid invoking our
    // own signal handler installed by InstallFailureSignalHandler().
#ifdef HAVE_SIGACTION
    struct sigaction sig_action;
    memset(&sig_action, 0, sizeof(sig_action));
    sigemptyset(&sig_action.sa_mask);
    sig_action.sa_handler = SIG_DFL;
    sigaction(SIGABRT, &sig_action, NULL);
#elif defined(OS_WINDOWS)
    signal(SIGABRT, SIG_DFL);
#endif  // HAVE_SIGACTION
  }

  abort();
}